

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

_Bool tbl_IsVictory(void)

{
  Card_t *pCVar1;
  SolStack_t *stackPtr;
  ulong uVar2;
  _Bool _Var3;
  
  pCVar1 = stk_CTopCard(ColorStacks);
  if (pCVar1 == (Card_t *)0x0) {
    _Var3 = false;
  }
  else {
    stackPtr = ColorStacks;
    _Var3 = false;
    uVar2 = 0;
    do {
      stackPtr = stackPtr + 1;
      if (pCVar1->m_type != CT_KING) {
        return _Var3;
      }
      _Var3 = 2 < uVar2;
      if (uVar2 == 3) {
        return _Var3;
      }
      pCVar1 = stk_CTopCard(stackPtr);
      uVar2 = uVar2 + 1;
    } while (pCVar1 != (Card_t *)0x0);
  }
  return _Var3;
}

Assistant:

bool tbl_IsVictory(void)
{
  for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
    const Card_t* cardPtr = stk_CTopCard(&ColorStacks[cc]);
    if (!cardPtr || cardPtr->m_type != CT_KING) {
      return false;
    }
  }
  return true;
}